

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  Fts5SegIter *pFVar1;
  uint uVar2;
  long lVar3;
  Fts5CResult *pFVar4;
  bool bVar5;
  Fts5SegIter *pFVar6;
  Fts5SegIter *pFVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Fts5SegIter *pFVar11;
  i64 iVar12;
  
  pFVar7 = pIter->aSeg + (uint)iChanged;
  lVar3 = pIter->aSeg[(uint)iChanged].iRowid;
  if ((lVar3 == pIter->iSwitchRowid) || (pIter->bRev == (uint)(lVar3 < pIter->iSwitchRowid))) {
    pFVar1 = pIter->aSeg;
    pFVar11 = pFVar1 + (iChanged ^ 1);
    uVar2 = pIter->bRev;
    iVar12 = -0x8000000000000000;
    if (uVar2 == 0) {
      iVar12 = 0x7fffffffffffffff;
    }
    pIter->iSwitchRowid = iVar12;
    pFVar4 = pIter->aFirst;
    uVar9 = iChanged + pIter->nSeg;
    do {
      uVar10 = (int)uVar9 / 2;
      if (pFVar4[(int)uVar10].bTermEq == '\0') {
LAB_001e22b4:
        pFVar4[(int)uVar10].iFirst = (u16)((uint)((int)pFVar7 - (int)pFVar1) >> 7);
        iVar8 = 0;
        if ((uVar9 & 0xfffffffe) == 2) {
          iVar8 = 2;
          goto LAB_001e22d1;
        }
        pFVar11 = pFVar1 + pFVar4[(int)(uVar10 ^ 1)].iFirst;
        bVar5 = true;
      }
      else {
        lVar3 = pFVar11->iRowid;
        if (pFVar7->iRowid != lVar3) {
          pFVar6 = pFVar11;
          if ((uVar2 == pFVar7->iRowid < lVar3) ||
             (pFVar6 = pFVar7, uVar2 == pIter->iSwitchRowid < lVar3)) {
            pFVar7 = pFVar6;
            pIter->iSwitchRowid = lVar3;
          }
          goto LAB_001e22b4;
        }
        iVar8 = 1;
LAB_001e22d1:
        bVar5 = false;
      }
      uVar9 = uVar10;
    } while (iVar8 == 0);
    if ((iVar8 != 2) && (!bVar5)) {
      return 1;
    }
  }
  *ppFirst = pFVar7;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}